

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widget.cpp
# Opt level: O2

void __thiscall polyscope::Widget::~Widget(Widget *this)

{
  iterator __position;
  Widget *local_10;
  
  this->_vptr_Widget = (_func_int **)&PTR_draw_0047c7e8;
  local_10 = this;
  __position = std::
               _Rb_tree<polyscope::Widget_*,_polyscope::Widget_*,_std::_Identity<polyscope::Widget_*>,_std::less<polyscope::Widget_*>,_std::allocator<polyscope::Widget_*>_>
               ::find((_Rb_tree<polyscope::Widget_*,_polyscope::Widget_*,_std::_Identity<polyscope::Widget_*>,_std::less<polyscope::Widget_*>,_std::allocator<polyscope::Widget_*>_>
                       *)state::widgets,&local_10);
  if (__position._M_node != (_Base_ptr)(state::widgets + 8)) {
    std::
    _Rb_tree<polyscope::Widget*,polyscope::Widget*,std::_Identity<polyscope::Widget*>,std::less<polyscope::Widget*>,std::allocator<polyscope::Widget*>>
    ::erase_abi_cxx11_((_Rb_tree<polyscope::Widget*,polyscope::Widget*,std::_Identity<polyscope::Widget*>,std::less<polyscope::Widget*>,std::allocator<polyscope::Widget*>>
                        *)state::widgets,(const_iterator)__position._M_node);
  }
  return;
}

Assistant:

Widget::~Widget() {
  auto pos = state::widgets.find(this);
  if (pos == state::widgets.end()) return;
  state::widgets.erase(pos);
}